

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::InstancedGridRenderTest::iterate
          (InstancedGridRenderTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  uint uVar8;
  deUint32 dVar9;
  RenderTarget *pRVar10;
  ShaderProgramDeclaration *pSVar11;
  pointer *__dest;
  ulong *__dest_00;
  char *description;
  value_type *__x;
  int iVar12;
  int iVar13;
  float fVar14;
  size_type __dnew_1;
  deUint32 drawIndirectBuf;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  deUint32 colorBuf;
  deUint32 positionBuf;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> offsets;
  size_type __dnew;
  deUint32 vaoID;
  deUint16 indices [6];
  Vec4 yellow;
  Vec4 green;
  Surface surface;
  DrawElementsCommand command;
  GLContext ctx;
  Vec4 vertexPositions [6];
  GridProgram program;
  ulong local_5a8;
  VertexToFragmentVarying local_5a0;
  undefined1 local_598 [8];
  pointer pVStack_590;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_588;
  GenericVecType local_578;
  uint local_568;
  uint local_564;
  uint local_560;
  float local_55c;
  ulong *local_558;
  ulong local_550;
  ulong local_548 [2];
  pointer *local_538;
  pointer local_530;
  pointer local_528 [2];
  VertexAttribute local_518;
  FragmentSource local_4f0;
  VertexSource local_4d0;
  undefined4 *local_4b0;
  undefined8 local_4a8;
  undefined4 local_4a0;
  undefined4 uStack_49c;
  value_type local_490;
  long local_480;
  undefined1 local_478;
  value_type local_470;
  long local_460;
  undefined2 local_458;
  undefined1 local_456;
  Surface local_450;
  VertexAttribute local_438;
  FragmentOutput local_40c;
  GLContext local_408;
  undefined1 local_298 [20];
  undefined8 local_284;
  undefined8 uStack_27c;
  float local_274;
  pointer local_270;
  undefined4 local_268;
  float local_264;
  pointer local_260;
  float local_258;
  undefined8 local_254;
  undefined4 local_24c;
  float local_248;
  float local_244;
  pointer local_240;
  ShaderProgram local_188;
  
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar12 = pRVar10->m_width;
  if (0x3ff < iVar12) {
    iVar12 = 0x400;
  }
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar13 = 0x400;
  if (pRVar10->m_height < 0x400) {
    iVar13 = pRVar10->m_height;
  }
  local_188.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  local_188.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = iVar12;
  local_188.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = iVar13;
  sglr::GLContext::GLContext
            (&local_408,((this->super_TestCase).m_context)->m_renderCtx,
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,3,
             (IVec4 *)&local_188);
  tcu::Surface::Surface(&local_450,iVar12,iVar13);
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)local_298);
  local_470.m_data._0_8_ = &local_460;
  local_460 = 0x697469736f705f61;
  local_458 = 0x6e6f;
  local_470.m_data[2] = 1.4013e-44;
  local_470.m_data[3] = 0.0;
  local_456 = 0;
  local_518.name._M_dataplus._M_p = (pointer)&local_518.name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_518);
  local_518.type = GENERICVECTYPE_FLOAT;
  pSVar11 = sglr::pdec::ShaderProgramDeclaration::operator<<
                      ((ShaderProgramDeclaration *)local_298,&local_518);
  local_490.m_data._0_8_ = &local_480;
  local_480 = 0x74657366666f5f61;
  local_490.m_data[2] = 1.12104e-44;
  local_490.m_data[3] = 0.0;
  local_478 = 0;
  local_598 = (undefined1  [8])&local_588;
  std::__cxx11::string::_M_construct<char*>((string *)local_598);
  local_578 = GENERICVECTYPE_FLOAT;
  pSVar11 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar11,(VertexAttribute *)local_598);
  local_4b0 = &local_4a0;
  local_4a0 = 0x6f635f61;
  local_4a8 = 7;
  uStack_49c = 0x726f6c;
  local_438.name._M_dataplus._M_p = (pointer)&local_438.name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_438);
  local_438.type = GENERICVECTYPE_FLOAT;
  pSVar11 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar11,&local_438);
  local_5a0.type = GENERICVECTYPE_FLOAT;
  local_5a0.flatshade = false;
  pSVar11 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar11,&local_5a0);
  local_40c.type = GENERICVECTYPE_FLOAT;
  pSVar11 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar11,&local_40c);
  local_4f0.source._M_dataplus._M_p = (pointer)0xbf;
  local_538 = local_528;
  __dest = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_538,(ulong)&local_4f0);
  _Var6._M_p = local_4f0.source._M_dataplus._M_p;
  local_528[0] = local_4f0.source._M_dataplus._M_p;
  local_538 = __dest;
  memcpy(__dest,
         "#version 310 es\nin highp vec4 a_position;\nin highp vec4 a_offset;\nin highp vec4 a_color;\nout highp vec4 v_color;\nvoid main(void)\n{\n\tgl_Position = a_position + a_offset;\n\tv_color = a_color;\n}\n"
         ,0xbf);
  local_530 = _Var6._M_p;
  *((long)__dest + _Var6._M_p) = '\0';
  local_4d0.source._M_dataplus._M_p = (pointer)&local_4d0.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4d0,local_538,_Var6._M_p + (long)local_538);
  pSVar11 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar11,&local_4d0);
  local_5a8 = 0x8a;
  local_558 = local_548;
  __dest_00 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_558,(ulong)&local_5a8);
  uVar2 = local_5a8;
  local_548[0] = local_5a8;
  local_558 = __dest_00;
  memcpy(__dest_00,
         "#version 310 es\nlayout(location = 0) out highp vec4 dEQP_FragColor;\nin highp vec4 v_color;\nvoid main(void)\n{\n\tdEQP_FragColor = v_color;\n}\n"
         ,0x8a);
  local_550 = uVar2;
  *(undefined1 *)((long)__dest_00 + uVar2) = 0;
  paVar1 = &local_4f0.source.field_2;
  local_4f0.source._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_4f0,local_558,uVar2 + (long)local_558);
  pSVar11 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar11,&local_4f0);
  sglr::ShaderProgram::ShaderProgram(&local_188,pSVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0.source._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f0.source._M_dataplus._M_p,
                    local_4f0.source.field_2._M_allocated_capacity + 1);
  }
  if (local_558 != local_548) {
    operator_delete(local_558,local_548[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0.source._M_dataplus._M_p != &local_4d0.source.field_2) {
    operator_delete(local_4d0.source._M_dataplus._M_p,
                    local_4d0.source.field_2._M_allocated_capacity + 1);
  }
  if (local_538 != local_528) {
    operator_delete(local_538,(ulong)(local_528[0] + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.name._M_dataplus._M_p != &local_438.name.field_2) {
    operator_delete(local_438.name._M_dataplus._M_p,
                    CONCAT44(local_438.name.field_2._M_allocated_capacity._4_4_,
                             local_438.name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_4b0 != &local_4a0) {
    operator_delete(local_4b0,CONCAT44(uStack_49c,local_4a0) + 1);
  }
  if (local_598 != (undefined1  [8])&local_588) {
    operator_delete((void *)local_598,local_588._M_allocated_capacity + 1);
  }
  if ((long *)local_490.m_data._0_8_ != &local_480) {
    operator_delete((void *)local_490.m_data._0_8_,local_480 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518.name._M_dataplus._M_p != &local_518.name.field_2) {
    operator_delete(local_518.name._M_dataplus._M_p,local_518.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((long *)local_470.m_data._0_8_ != &local_460) {
    operator_delete((void *)local_470.m_data._0_8_,local_460 + 1);
  }
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)local_298);
  local_188.super_VertexShader._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00b45208;
  local_188.super_GeometryShader._vptr_GeometryShader = (_func_int **)&DAT_00b45240;
  local_188.super_FragmentShader._vptr_FragmentShader = (_func_int **)&DAT_00b45258;
  local_470.m_data[0] = 0.0;
  local_470.m_data[1] = 1.0;
  local_470.m_data[2] = 0.0;
  local_470.m_data[3] = 1.0;
  local_490.m_data[0] = 1.0;
  local_490.m_data[1] = 1.0;
  local_490.m_data[2] = 0.0;
  local_490.m_data[3] = 1.0;
  local_4d0.source._M_dataplus._M_p = local_4d0.source._M_dataplus._M_p & 0xffffffff00000000;
  local_538 = (pointer *)((ulong)local_538 & 0xffffffff00000000);
  local_4f0.source._M_dataplus._M_p = local_4f0.source._M_dataplus._M_p & 0xffffffff00000000;
  local_558 = (ulong *)((ulong)local_558 & 0xffffffff00000000);
  local_5a8 = local_5a8 & 0xffffffff00000000;
  local_5a0.type = GENERICVECTYPE_FLOAT;
  uVar8 = (*local_408.super_Context._vptr_Context[0x75])();
  local_560 = (*local_408.super_Context._vptr_Context[0x59])(&local_408,(ulong)uVar8,"a_position");
  local_564 = (*local_408.super_Context._vptr_Context[0x59])(&local_408,(ulong)uVar8,"a_offset");
  local_568 = (*local_408.super_Context._vptr_Context[0x59])(&local_408,(ulong)uVar8,"a_color");
  fVar14 = 2.0 / (float)this->m_gridSide;
  local_298._0_8_ = (pointer)0x0;
  local_298._8_8_ = (pointer)0x3f80000000000000;
  local_284 = 0;
  uStack_27c = 0x3f800000;
  local_270 = (pointer)0x3f80000000000000;
  local_268 = 0;
  local_260 = (pointer)0x3f80000000000000;
  iVar12 = 0;
  local_254 = 0;
  local_24c = 0x3f800000;
  local_240 = (pointer)0x3f80000000000000;
  local_4b0 = (undefined4 *)0x2000300040000;
  local_4a8 = CONCAT44(local_4a8._4_4_,0x50001);
  local_518.name.field_2._M_allocated_capacity = 0;
  local_518.name._M_dataplus._M_p = (pointer)0x0;
  local_518.name._M_string_length = 0;
  local_298._16_4_ = fVar14;
  local_274 = fVar14;
  local_264 = fVar14;
  local_258 = fVar14;
  local_248 = fVar14;
  local_244 = fVar14;
  if (0 < this->m_gridSide) {
    do {
      if (0 < this->m_gridSide) {
        local_55c = (float)iVar12 * fVar14 + -1.0;
        iVar13 = 0;
        do {
          local_598._4_4_ = (float)iVar13 * fVar14 + -1.0;
          local_598._0_4_ = local_55c;
          pVStack_590 = (pointer)0x0;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_518
                     ,(Vector<float,_4> *)local_598);
          iVar13 = iVar13 + 1;
        } while (iVar13 < this->m_gridSide);
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 < this->m_gridSide);
  }
  local_598 = (undefined1  [8])0x0;
  pVStack_590 = (pointer)0x0;
  local_588._M_allocated_capacity = 0;
  if (0 < this->m_gridSide) {
    iVar12 = 0;
    do {
      if (0 < this->m_gridSide) {
        iVar13 = 0;
        do {
          __x = &local_490;
          if ((iVar12 + iVar13 & 1U) == 0) {
            __x = &local_470;
          }
          std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                     local_598,__x);
          iVar13 = iVar13 + 1;
        } while (iVar13 < this->m_gridSide);
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 < this->m_gridSide);
  }
  (*local_408.super_Context._vptr_Context[0x4c])(&local_408,1,&local_4d0);
  uVar5 = local_560;
  uVar4 = local_564;
  uVar3 = local_568;
  (*local_408.super_Context._vptr_Context[0x4b])
            (&local_408,(ulong)local_4d0.source._M_dataplus._M_p & 0xffffffff);
  (*local_408.super_Context._vptr_Context[0x26])(&local_408,1,&local_538);
  (*local_408.super_Context._vptr_Context[0x25])(&local_408,0x8892,(ulong)local_538 & 0xffffffff);
  (*local_408.super_Context._vptr_Context[0x28])(&local_408,0x8892,0x60,local_298,0x88e4);
  (*local_408.super_Context._vptr_Context[0x4e])(&local_408,(ulong)uVar5,4,0x1406,0,0,0);
  (*local_408.super_Context._vptr_Context[0x52])(&local_408,(ulong)uVar5,0);
  (*local_408.super_Context._vptr_Context[0x50])(&local_408,(ulong)uVar5);
  (*local_408.super_Context._vptr_Context[0x26])(&local_408,1,&local_4f0);
  (*local_408.super_Context._vptr_Context[0x25])
            (&local_408,0x8892,(ulong)local_4f0.source._M_dataplus._M_p & 0xffffffff);
  (*local_408.super_Context._vptr_Context[0x28])
            (&local_408,0x8892,
             local_518.name._M_string_length - (long)local_518.name._M_dataplus._M_p,
             local_518.name._M_dataplus._M_p,0x88e4);
  (*local_408.super_Context._vptr_Context[0x4e])(&local_408,(ulong)uVar4,4,0x1406,0,0,0);
  (*local_408.super_Context._vptr_Context[0x52])(&local_408,(ulong)uVar4,1);
  (*local_408.super_Context._vptr_Context[0x50])(&local_408,(ulong)uVar4);
  (*local_408.super_Context._vptr_Context[0x26])(&local_408,1,&local_558);
  (*local_408.super_Context._vptr_Context[0x25])(&local_408,0x8892,(ulong)local_558 & 0xffffffff);
  (*local_408.super_Context._vptr_Context[0x28])
            (&local_408,0x8892,(long)pVStack_590 - (long)local_598,local_598,0x88e4);
  (*local_408.super_Context._vptr_Context[0x4e])(&local_408,(ulong)uVar3,4,0x1406,0,0,0);
  (*local_408.super_Context._vptr_Context[0x52])(&local_408,(ulong)uVar3,1);
  (*local_408.super_Context._vptr_Context[0x50])(&local_408,(ulong)uVar3);
  if (this->m_useIndices == true) {
    (*local_408.super_Context._vptr_Context[0x26])(&local_408,1,&local_5a8);
    (*local_408.super_Context._vptr_Context[0x25])(&local_408,0x8893,local_5a8 & 0xffffffff);
    (*local_408.super_Context._vptr_Context[0x28])(&local_408,0x8893,0xc,&local_4b0,0x88e4);
  }
  (*local_408.super_Context._vptr_Context[0x26])(&local_408,1,&local_5a0);
  (*local_408.super_Context._vptr_Context[0x25])(&local_408,0x8f3f,(ulong)local_5a0.type);
  if (this->m_useIndices == true) {
    local_438.name._M_dataplus._M_p._4_4_ = this->m_gridSide * this->m_gridSide;
    local_438.name._M_dataplus._M_p._0_4_ = 6;
    local_438.name._M_string_length = 0;
    local_438.name.field_2._M_allocated_capacity._0_4_ = 0;
    (*local_408.super_Context._vptr_Context[0x28])(&local_408,0x8f3f,0x14,&local_438,0x88e4);
  }
  else {
    local_438.name._M_dataplus._M_p._4_4_ = this->m_gridSide * this->m_gridSide;
    local_438.name._M_dataplus._M_p._0_4_ = 6;
    local_438.name._M_string_length = 0;
    (*local_408.super_Context._vptr_Context[0x28])(&local_408,0x8f3f,0x10,&local_438,0x88e4);
  }
  (*local_408.super_Context._vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*local_408.super_Context._vptr_Context[0x2d])(&local_408,0x4000);
  (*local_408.super_Context._vptr_Context[5])
            (&local_408,0,0,(ulong)(uint)local_450.m_width,(ulong)(uint)local_450.m_height);
  (*local_408.super_Context._vptr_Context[0x76])(&local_408,(ulong)uVar8);
  if (this->m_useIndices == true) {
    (*local_408.super_Context._vptr_Context[0x71])(&local_408,4,0x1403,0);
  }
  else {
    (*local_408.super_Context._vptr_Context[0x70])(&local_408,4,0);
  }
  (*local_408.super_Context._vptr_Context[0x76])(&local_408,0);
  dVar9 = (*local_408.super_Context._vptr_Context[0x79])();
  glu::checkError(dVar9,SSBOArrayLengthTests::init::arraysSized + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x398);
  (*local_408.super_Context._vptr_Context[0x27])(&local_408,1,&local_5a0);
  if (this->m_useIndices == true) {
    (*local_408.super_Context._vptr_Context[0x27])(&local_408,1,&local_5a8);
  }
  (*local_408.super_Context._vptr_Context[0x27])(&local_408,1,&local_558);
  (*local_408.super_Context._vptr_Context[0x27])(&local_408,1,&local_4f0);
  (*local_408.super_Context._vptr_Context[0x27])(&local_408,1,&local_538);
  (*local_408.super_Context._vptr_Context[0x4d])(&local_408,1,&local_4d0);
  (*local_408.super_Context._vptr_Context[0x77])(&local_408,(ulong)uVar8);
  (*local_408.super_Context._vptr_Context[0x7a])();
  (*local_408.super_Context._vptr_Context[0x80])
            (&local_408,&local_450,0,0,(ulong)(uint)local_450.m_width,
             (ulong)(uint)local_450.m_height);
  dVar9 = (*local_408.super_Context._vptr_Context[0x79])();
  glu::checkError(dVar9,SSBOArrayLengthTests::init::arraysSized + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x3a6);
  if (local_598 != (undefined1  [8])0x0) {
    operator_delete((void *)local_598,local_588._M_allocated_capacity - (long)local_598);
  }
  if (local_518.name._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_518.name._M_dataplus._M_p,
                    local_518.name.field_2._M_allocated_capacity -
                    (long)local_518.name._M_dataplus._M_p);
  }
  bVar7 = verifyImageYellowGreen
                    (&local_450,
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  description = "Result image invalid";
  if (bVar7) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar7,description
            );
  sglr::ShaderProgram::~ShaderProgram(&local_188);
  tcu::Surface::~Surface(&local_450);
  sglr::GLContext::~GLContext(&local_408);
  return STOP;
}

Assistant:

InstancedGridRenderTest::IterateResult InstancedGridRenderTest::iterate (void)
{
	const int renderTargetWidth  = de::min(1024, m_context.getRenderTarget().getWidth());
	const int renderTargetHeight = de::min(1024, m_context.getRenderTarget().getHeight());

	sglr::GLContext ctx		(m_context.getRenderContext(), m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS | sglr::GLCONTEXT_LOG_PROGRAMS, tcu::IVec4(0, 0, renderTargetWidth, renderTargetHeight));
	tcu::Surface	surface	(renderTargetWidth, renderTargetHeight);
	GridProgram		program;

	// render

	renderTo(ctx, program, surface);

	// verify image
	// \note the green/yellow pattern is only for clarity. The test will only verify that all instances were drawn by looking for anything non-green/yellow.
	if (verifyImageYellowGreen(surface, m_testCtx.getLog()))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result image invalid");
	return STOP;
}